

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionObject.cpp
# Opt level: O0

char * __thiscall
btCollisionObject::serialize(btCollisionObject *this,void *dataBuffer,btSerializer *serializer)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *in_RDX;
  undefined8 *in_RSI;
  btTransform *in_RDI;
  char *name;
  btCollisionObjectFloatData *dataOut;
  btTransformFloatData *in_stack_ffffffffffffffc8;
  
  btTransform::serialize(in_RDI,in_stack_ffffffffffffffc8);
  btTransform::serialize(in_RDI,in_stack_ffffffffffffffc8);
  btVector3::serialize
            ((btVector3 *)(in_RDI[2].m_basis.m_el[0].m_floats + 2),
             (btVector3FloatData *)(in_RSI + 0x14));
  btVector3::serialize
            ((btVector3 *)(in_RDI[2].m_basis.m_el[1].m_floats + 2),
             (btVector3FloatData *)(in_RSI + 0x16));
  btVector3::serialize
            ((btVector3 *)(in_RDI[2].m_basis.m_el[2].m_floats + 2),
             (btVector3FloatData *)(in_RSI + 0x18));
  *(btScalar *)(in_RSI + 0x1e) = in_RDI[2].m_origin.m_floats[2];
  *(btScalar *)(in_RSI + 0x1a) = in_RDI[2].m_origin.m_floats[3];
  *in_RSI = 0;
  uVar1 = (**(code **)(*in_RDX + 0x38))
                    (in_RDX,*(undefined8 *)(in_RDI[3].m_basis.m_el[0].m_floats + 2));
  in_RSI[1] = uVar1;
  in_RSI[2] = 0;
  *(btScalar *)((long)in_RSI + 0xf4) = in_RDI[3].m_basis.m_el[2].m_floats[0];
  *(btScalar *)(in_RSI + 0x1f) = in_RDI[3].m_basis.m_el[2].m_floats[1];
  *(btScalar *)((long)in_RSI + 0xfc) = in_RDI[3].m_basis.m_el[2].m_floats[2];
  *(btScalar *)(in_RSI + 0x20) = in_RDI[3].m_basis.m_el[2].m_floats[3];
  *(btScalar *)((long)in_RSI + 0xd4) = in_RDI[3].m_origin.m_floats[0];
  *(btScalar *)(in_RSI + 0x1b) = in_RDI[3].m_origin.m_floats[1];
  *(btScalar *)((long)in_RSI + 0xdc) = in_RDI[3].m_origin.m_floats[3];
  *(btScalar *)(in_RSI + 0x1c) = in_RDI[3].m_origin.m_floats[2];
  *(btScalar *)((long)in_RSI + 0x104) = in_RDI[4].m_basis.m_el[0].m_floats[0];
  uVar1 = (**(code **)(*in_RDX + 0x50))();
  uVar2 = (**(code **)(*in_RDX + 0x38))(in_RDX,uVar1);
  in_RSI[3] = uVar2;
  if (in_RSI[3] != 0) {
    (**(code **)(*in_RDX + 0x60))(in_RDX,uVar1);
  }
  *(btScalar *)((long)in_RSI + 0xe4) = in_RDI[4].m_basis.m_el[1].m_floats[1];
  *(btScalar *)(in_RSI + 0x1d) = in_RDI[4].m_basis.m_el[1].m_floats[2];
  *(btScalar *)((long)in_RSI + 0xec) = in_RDI[4].m_basis.m_el[1].m_floats[3];
  *(btScalar *)(in_RSI + 0x21) = in_RDI[4].m_basis.m_el[2].m_floats[0];
  return "btCollisionObjectFloatData";
}

Assistant:

const char* btCollisionObject::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btCollisionObjectData* dataOut = (btCollisionObjectData*)dataBuffer;

	m_worldTransform.serialize(dataOut->m_worldTransform);
	m_interpolationWorldTransform.serialize(dataOut->m_interpolationWorldTransform);
	m_interpolationLinearVelocity.serialize(dataOut->m_interpolationLinearVelocity);
	m_interpolationAngularVelocity.serialize(dataOut->m_interpolationAngularVelocity);
	m_anisotropicFriction.serialize(dataOut->m_anisotropicFriction);
	dataOut->m_hasAnisotropicFriction = m_hasAnisotropicFriction;
	dataOut->m_contactProcessingThreshold = m_contactProcessingThreshold;
	dataOut->m_broadphaseHandle = 0;
	dataOut->m_collisionShape = serializer->getUniquePointer(m_collisionShape);
	dataOut->m_rootCollisionShape = 0;//@todo
	dataOut->m_collisionFlags = m_collisionFlags;
	dataOut->m_islandTag1 = m_islandTag1;
	dataOut->m_companionId = m_companionId;
	dataOut->m_activationState1 = m_activationState1;
	dataOut->m_deactivationTime = m_deactivationTime;
	dataOut->m_friction = m_friction;
	dataOut->m_rollingFriction = m_rollingFriction;
	dataOut->m_restitution = m_restitution;
	dataOut->m_internalType = m_internalType;
	
	char* name = (char*) serializer->findNameForPointer(this);
	dataOut->m_name = (char*)serializer->getUniquePointer(name);
	if (dataOut->m_name)
	{
		serializer->serializeName(name);
	}
	dataOut->m_hitFraction = m_hitFraction;
	dataOut->m_ccdSweptSphereRadius = m_ccdSweptSphereRadius;
	dataOut->m_ccdMotionThreshold = m_ccdMotionThreshold;
	dataOut->m_checkCollideWith = m_checkCollideWith;

	return btCollisionObjectDataName;
}